

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

char * hts_format_description(htsFormat *format)

{
  int iVar1;
  char *pcVar2;
  undefined1 auStack_28 [8];
  kstring_t str;
  htsFormat *format_local;
  
  auStack_28 = (undefined1  [8])0x0;
  str.l = 0;
  str.m = 0;
  str.s = (char *)format;
  switch(format->format) {
  case sam:
    kputs("SAM",(kstring_t *)auStack_28);
    break;
  case bam:
    kputs("BAM",(kstring_t *)auStack_28);
    break;
  case bai:
    kputs("BAI",(kstring_t *)auStack_28);
    break;
  case cram:
    kputs("CRAM",(kstring_t *)auStack_28);
    break;
  case crai:
    kputs("CRAI",(kstring_t *)auStack_28);
    break;
  case vcf:
    kputs("VCF",(kstring_t *)auStack_28);
    break;
  case bcf:
    if ((format->version).major == 1) {
      kputs("Legacy BCF",(kstring_t *)auStack_28);
    }
    else {
      kputs("BCF",(kstring_t *)auStack_28);
    }
    break;
  case csi:
    kputs("CSI",(kstring_t *)auStack_28);
    break;
  default:
    kputs("unknown",(kstring_t *)auStack_28);
    break;
  case tbi:
    kputs("Tabix",(kstring_t *)auStack_28);
  }
  if (-1 < *(short *)(str.s + 8)) {
    kputs(" version ",(kstring_t *)auStack_28);
    kputw((int)*(short *)(str.s + 8),(kstring_t *)auStack_28);
    if (-1 < *(short *)(str.s + 10)) {
      kputc(0x2e,(kstring_t *)auStack_28);
      kputw((int)*(short *)(str.s + 10),(kstring_t *)auStack_28);
    }
  }
  iVar1 = *(int *)(str.s + 0xc);
  if (iVar1 == 1) {
    kputs(" gzip-compressed",(kstring_t *)auStack_28);
  }
  else if (iVar1 == 2) {
    iVar1 = *(int *)(str.s + 4);
    if (((iVar1 == 4) || (iVar1 - 9U < 2)) || (iVar1 == 0xc)) {
      kputs(" compressed",(kstring_t *)auStack_28);
    }
    else {
      kputs(" BGZF-compressed",(kstring_t *)auStack_28);
    }
  }
  else if (iVar1 == 3) {
    kputs(" compressed",(kstring_t *)auStack_28);
  }
  switch(*(undefined4 *)str.s) {
  case 1:
    kputs(" sequence",(kstring_t *)auStack_28);
    break;
  case 2:
    kputs(" variant calling",(kstring_t *)auStack_28);
    break;
  case 3:
    kputs(" index",(kstring_t *)auStack_28);
    break;
  case 4:
    kputs(" genomic region",(kstring_t *)auStack_28);
  }
  if (*(int *)(str.s + 0xc) == 0) {
    iVar1 = *(int *)(str.s + 4);
    if (((iVar1 == 3) || (iVar1 - 7U < 2)) || (iVar1 == 0xd)) {
      kputs(" text",(kstring_t *)auStack_28);
    }
    else {
      kputs(" data",(kstring_t *)auStack_28);
    }
  }
  else {
    kputs(" data",(kstring_t *)auStack_28);
  }
  pcVar2 = ks_release((kstring_t *)auStack_28);
  return pcVar2;
}

Assistant:

char *hts_format_description(const htsFormat *format)
{
    kstring_t str = { 0, 0, NULL };

    switch (format->format) {
    case sam:   kputs("SAM", &str); break;
    case bam:   kputs("BAM", &str); break;
    case cram:  kputs("CRAM", &str); break;
    case vcf:   kputs("VCF", &str); break;
    case bcf:
        if (format->version.major == 1) kputs("Legacy BCF", &str);
        else kputs("BCF", &str);
        break;
    case bai:   kputs("BAI", &str); break;
    case crai:  kputs("CRAI", &str); break;
    case csi:   kputs("CSI", &str); break;
    case tbi:   kputs("Tabix", &str); break;
    default:    kputs("unknown", &str); break;
    }

    if (format->version.major >= 0) {
        kputs(" version ", &str);
        kputw(format->version.major, &str);
        if (format->version.minor >= 0) {
            kputc('.', &str);
            kputw(format->version.minor, &str);
        }
    }

    switch (format->compression) {
    case custom: kputs(" compressed", &str); break;
    case gzip:   kputs(" gzip-compressed", &str); break;
    case bgzf:
        switch (format->format) {
        case bam:
        case bcf:
        case csi:
        case tbi:
            // These are by definition BGZF, so just use the generic term
            kputs(" compressed", &str);
            break;
        default:
            kputs(" BGZF-compressed", &str);
            break;
        }
        break;
    default: break;
    }

    switch (format->category) {
    case sequence_data: kputs(" sequence", &str); break;
    case variant_data:  kputs(" variant calling", &str); break;
    case index_file:    kputs(" index", &str); break;
    case region_list:   kputs(" genomic region", &str); break;
    default: break;
    }

    if (format->compression == no_compression)
        switch (format->format) {
        case sam:
        case crai:
        case vcf:
        case bed:
            kputs(" text", &str);
            break;

        default:
            kputs(" data", &str);
            break;
        }
    else
        kputs(" data", &str);

    return ks_release(&str);
}